

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall xLearn::Solver::start_train_work(Solver *this)

{
  string *filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int epoch;
  int stop_window;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  byte bVar8;
  string *filename_00;
  float fVar9;
  Modifier reset;
  Modifier bold;
  string local_d0;
  Modifier reset_2;
  Modifier green;
  Trainer trainer;
  
  bVar2 = (this->hyper_param_).early_stop;
  epoch = (this->hyper_param_).num_epoch;
  stop_window = (this->hyper_param_).stop_window;
  bVar8 = (this->hyper_param_).cross_validation ^ 1;
  bVar3 = (this->hyper_param_).quiet;
  filename_00 = &(this->hyper_param_).model_file;
  iVar6 = std::__cxx11::string::compare((char *)filename_00);
  if ((iVar6 == 0) || (bVar4 = true, (this->hyper_param_).cross_validation == true)) {
    bVar4 = false;
  }
  filename = &(this->hyper_param_).txt_model_file;
  iVar6 = std::__cxx11::string::compare((char *)filename);
  if ((iVar6 == 0) || (bVar5 = true, (this->hyper_param_).cross_validation == true)) {
    bVar5 = false;
  }
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Trainer::Initialize(&trainer,&this->reader_,epoch,this->model_,this->loss_,this->metric_,
                      (bool)(bVar2 & bVar8),stop_window,(bool)(bVar8 & bVar3));
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Start to train ...","");
  bold.code = BOLD;
  reset.code = RESET;
  green.code = FG_GREEN;
  poVar7 = Color::operator<<((ostream *)&std::cout,&green);
  poVar7 = Color::operator<<(poVar7,&bold);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  poVar7 = Color::operator<<(poVar7,&reset);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((this->hyper_param_).cross_validation == true) {
    Trainer::CVTrain(&trainer);
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Finish Cross-Validation","");
    bold.code = BOLD;
    reset.code = RESET;
    green.code = FG_GREEN;
    poVar7 = Color::operator<<((ostream *)&std::cout,&green);
    poVar7 = Color::operator<<(poVar7,&bold);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    poVar7 = Color::operator<<(poVar7,&reset);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    Trainer::Train(&trainer);
    if (bVar4) {
      Timer::Timer((Timer *)&green);
      Timer::tic((Timer *)&green);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Start to save model ...","");
      reset.code = BOLD;
      reset_2.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      poVar7 = Color::operator<<(poVar7,&reset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      poVar7 = Color::operator<<(poVar7,&reset_2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Trainer::SaveModel(&trainer,filename_00);
      StringPrintf_abi_cxx11_(&local_d0,"Model file: %s",(filename_00->_M_dataplus)._M_p);
      reset.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[------------] ",0xf);
      poVar7 = Color::operator<<(poVar7,&reset);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      fVar9 = Timer::toc((Timer *)&green);
      StringPrintf_abi_cxx11_(&local_d0,"Time cost for saving model: %.2f (sec)",(double)fVar9);
      reset.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[------------] ",0xf);
      poVar7 = Color::operator<<(poVar7,&reset);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if (bVar5) {
      Timer::Timer((Timer *)&green);
      Timer::tic((Timer *)&green);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Start to save txt model ...","");
      reset.code = BOLD;
      reset_2.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      poVar7 = Color::operator<<(poVar7,&reset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      poVar7 = Color::operator<<(poVar7,&reset_2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Trainer::SaveTxtModel(&trainer,filename);
      StringPrintf_abi_cxx11_(&local_d0,"TXT Model file: %s",(filename->_M_dataplus)._M_p);
      reset.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[------------] ",0xf);
      poVar7 = Color::operator<<(poVar7,&reset);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      fVar9 = Timer::toc((Timer *)&green);
      StringPrintf_abi_cxx11_(&local_d0,"Time cost for saving txt model: %.2f (sec)",(double)fVar9);
      reset.code = RESET;
      bold.code = FG_GREEN;
      poVar7 = Color::operator<<((ostream *)&std::cout,&bold);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[------------] ",0xf);
      poVar7 = Color::operator<<(poVar7,&reset);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Finish training","");
    bold.code = BOLD;
    reset.code = RESET;
    green.code = FG_GREEN;
    poVar7 = Color::operator<<((ostream *)&std::cout,&green);
    poVar7 = Color::operator<<(poVar7,&bold);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    poVar7 = Color::operator<<(poVar7,&reset);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  Trainer::~Trainer(&trainer);
  return;
}

Assistant:

void Solver::start_train_work() {
  int epoch = hyper_param_.num_epoch;
  bool early_stop = hyper_param_.early_stop &&
                   !hyper_param_.cross_validation;
  int stop_window = hyper_param_.stop_window;
  bool quiet = hyper_param_.quiet &&
              !hyper_param_.cross_validation;
  bool save_model = true;
  bool save_txt_model = true;
  if (hyper_param_.model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_model = false;
  }
  if (hyper_param_.txt_model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_txt_model = false;
  }
  Trainer trainer;
  trainer.Initialize(reader_,  /* Reader list */
                     epoch,
                     model_,
                     loss_,
                     metric_,
                     early_stop,
                     stop_window,
                     quiet);
  Color::print_action("Start to train ...");
/******************************************************************************
 * Training under cross-validation                                            *
 ******************************************************************************/
  if (hyper_param_.cross_validation) {
    trainer.CVTrain();
    Color::print_action("Finish Cross-Validation");
  } 
/******************************************************************************
 * Original training without cross-validation                                 *
 ******************************************************************************/
  else {
    // The training process
    trainer.Train();
    // Save binary model
    if (save_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save model ...");
      trainer.SaveModel(hyper_param_.model_file);
      Color::print_info(
        StringPrintf("Model file: %s", hyper_param_.model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving model: %.2f (sec)", timer.toc())
      );
    }
    // Save TXT model 
    if (save_txt_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save txt model ...");
      trainer.SaveTxtModel(hyper_param_.txt_model_file);
      Color::print_info(
        StringPrintf("TXT Model file: %s", hyper_param_.txt_model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving txt model: %.2f (sec)", timer.toc())
      );
    }
    Color::print_action("Finish training");
  }
}